

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

void __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::Value,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<duckdb::Value,_true> *ret)

{
  ulong uVar1;
  undefined8 in_RDX;
  undefined2 in_SI;
  vector<duckdb::Value,_true> *in_RDI;
  Deserializer *in_stack_00000028;
  vector<duckdb::Value,_true> *in_stack_ffffffffffffffb0;
  
  uVar1 = (*(code *)(((in_RDI->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                      super__Vector_impl_data._M_start)->value_).bigint)(in_RDI,in_SI,in_RDX,in_SI);
  if ((uVar1 & 1) == 0) {
    SerializationDefaultValue::GetDefault<duckdb::vector<duckdb::Value,true>>();
    vector<duckdb::Value,_true>::operator=(in_stack_ffffffffffffffb0,in_RDI);
    vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0xaf6e2e);
    (*(code *)(((in_RDI->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_start)->value_).hugeint.upper)(in_RDI,0);
  }
  else {
    Read<duckdb::vector<duckdb::Value,true>>(in_stack_00000028);
    vector<duckdb::Value,_true>::operator=(in_stack_ffffffffffffffb0,in_RDI);
    vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0xaf6e63);
    (*(code *)(((in_RDI->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_start)->value_).hugeint.upper)(in_RDI,1);
  }
  return;
}

Assistant:

inline void ReadPropertyWithDefault(const field_id_t field_id, const char *tag, T &ret) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(SerializationDefaultValue::GetDefault<T>());
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}